

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  bool bVar1;
  byte bVar2;
  char *filename;
  size_type sVar3;
  undefined8 uVar4;
  ulong uVar5;
  string local_130;
  uint local_110;
  uint local_10c;
  uint minor;
  uint major;
  size_type local_e8;
  size_type suffix;
  size_type local_c0;
  size_type prefix;
  string *testName;
  string *origName;
  _Self local_a0;
  const_iterator fi;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  undefined1 local_80 [8];
  string dir;
  uint bestMinor;
  uint bestMajor;
  size_type bestSuffix;
  size_type bestPrefix;
  Name *local_28;
  Name *name_local;
  string *path_local;
  cmFindLibraryHelper *this_local;
  
  local_28 = name;
  name_local = (Name *)path;
  path_local = (string *)this;
  if ((name->TryRaw & 1U) != 0) {
    std::__cxx11::string::operator=((string *)&this->TestPath,(string *)path);
    std::__cxx11::string::operator+=((string *)&this->TestPath,(string *)&local_28->Raw);
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath((string *)&bestPrefix,&this->TestPath);
      std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&bestPrefix);
      std::__cxx11::string::~string((string *)&bestPrefix);
      cmsys::SystemTools::ConvertToUnixSlashes(&this->BestPath);
      this_local._7_1_ = 1;
      goto LAB_006ae7f8;
    }
  }
  bestSuffix = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->Prefixes);
  _bestMinor = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->Suffixes);
  dir.field_2._12_4_ = 0;
  dir.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)local_80,(string *)name_local);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_80);
  fi._M_node = (_Base_ptr)cmGlobalGenerator::GetDirectoryContent(this->GG,(string *)local_80,true);
  local_a0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)fi._M_node);
  while( true ) {
    origName = (string *)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)fi._M_node);
    bVar1 = std::operator!=(&local_a0,(_Self *)&origName);
    if (!bVar1) break;
    prefix = (size_type)
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_a0);
    testName = (string *)prefix;
    bVar1 = cmsys::RegularExpression::find(&local_28->Regex,(string *)prefix);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->TestPath,(string *)name_local);
      std::__cxx11::string::operator+=((string *)&this->TestPath,(string *)testName);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&this->TestPath);
      if (!bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_((string *)&suffix,&local_28->Regex,1);
        sVar3 = GetPrefixIndex(this,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
        local_c0 = sVar3;
        cmsys::RegularExpression::match_abi_cxx11_((string *)&minor,&local_28->Regex,2);
        sVar3 = GetSuffixIndex(this,(string *)&minor);
        std::__cxx11::string::~string((string *)&minor);
        local_10c = 0;
        local_110 = 0;
        local_e8 = sVar3;
        if ((this->OpenBSD & 1U) != 0) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_130,&local_28->Regex,3);
          uVar4 = std::__cxx11::string::c_str();
          __isoc99_sscanf(uVar4,".%u.%u",&local_10c,&local_110);
          std::__cxx11::string::~string((string *)&local_130);
        }
        uVar5 = std::__cxx11::string::empty();
        if (((((uVar5 & 1) != 0) || (local_c0 < bestSuffix)) ||
            ((local_c0 == bestSuffix && (local_e8 < _bestMinor)))) ||
           (((local_c0 == bestSuffix && (local_e8 == _bestMinor)) &&
            (((uint)dir.field_2._12_4_ < local_10c ||
             ((local_10c == dir.field_2._12_4_ && ((uint)dir.field_2._8_4_ < local_110)))))))) {
          std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&this->TestPath);
          bestSuffix = local_c0;
          _bestMinor = local_e8;
          dir.field_2._12_4_ = local_10c;
          dir.field_2._8_4_ = local_110;
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a0);
  }
  bVar2 = std::__cxx11::string::empty();
  this_local._7_1_ = (bVar2 ^ 0xff) & 1;
  std::__cxx11::string::~string((string *)local_80);
LAB_006ae7f8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if(name.TryRaw)
    {
    this->TestPath = path;
    this->TestPath += name.Raw;
    if(cmSystemTools::FileExists(this->TestPath.c_str(), true))
      {
      this->BestPath =
        cmSystemTools::CollapseFullPath(this->TestPath);
      cmSystemTools::ConvertToUnixSlashes(this->BestPath);
      return true;
      }
    }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for(std::set<std::string>::const_iterator fi = files.begin();
      fi != files.end(); ++fi)
    {
    std::string const& origName = *fi;
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if(name.Regex.find(testName))
      {
      this->TestPath = path;
      this->TestPath += origName;
      if(!cmSystemTools::FileIsDirectory(this->TestPath))
        {
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if(this->OpenBSD)
          {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
          }
        if(this->BestPath.empty() || prefix < bestPrefix ||
           (prefix == bestPrefix && suffix < bestSuffix) ||
           (prefix == bestPrefix && suffix == bestSuffix &&
            (major > bestMajor ||
             (major == bestMajor && minor > bestMinor))))
          {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
          }
        }
      }
    }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}